

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O0

TriangleLight *
embree::SceneGraph::TriangleLight::lerp(TriangleLight *light0,TriangleLight *light1,float f)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  long in_RDX;
  long in_RSI;
  TriangleLight *in_RDI;
  float in_XMM0_Da;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 *local_860;
  undefined8 *local_858;
  undefined1 *local_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 *local_830;
  undefined8 *local_828;
  undefined1 *local_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 *local_800;
  undefined8 *local_7f8;
  undefined8 *local_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 *local_7d0;
  undefined8 *local_7c8;
  undefined8 *local_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 *local_7a8;
  undefined8 *local_7a0;
  float local_794;
  undefined8 *local_790;
  float local_784;
  undefined8 *local_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 *local_760;
  undefined8 *local_758;
  undefined8 *local_750;
  undefined8 *local_748;
  undefined8 *local_740;
  undefined8 *local_738;
  undefined8 *local_730;
  float local_728;
  float fStack_724;
  float fStack_720;
  float fStack_71c;
  undefined8 *local_718;
  undefined8 *local_710;
  undefined8 *local_708;
  undefined8 *local_700;
  float local_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  undefined8 *local_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  float local_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float local_69c;
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 *local_668;
  undefined8 *local_660;
  float local_654;
  undefined8 *local_650;
  float local_644;
  undefined8 *local_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 *local_620;
  undefined8 *local_618;
  undefined8 *local_610;
  undefined8 *local_608;
  undefined8 *local_600;
  undefined8 *local_5f8;
  undefined8 *local_5f0;
  float local_5e8;
  float fStack_5e4;
  float fStack_5e0;
  float fStack_5dc;
  undefined8 *local_5d8;
  undefined8 *local_5d0;
  undefined8 *local_5c8;
  undefined8 *local_5c0;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  undefined8 *local_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float local_55c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 *local_528;
  undefined8 *local_520;
  float local_514;
  undefined1 *local_510;
  float local_504;
  undefined8 *local_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 *local_4e0;
  undefined8 *local_4d8;
  undefined8 *local_4d0;
  undefined1 *local_4c8;
  undefined8 *local_4c0;
  undefined8 *local_4b8;
  undefined1 *local_4b0;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  undefined1 *local_498;
  undefined8 *local_490;
  undefined8 *local_488;
  undefined8 *local_480;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined8 *local_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_41c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 *local_3e8;
  undefined8 *local_3e0;
  float local_3d4;
  undefined1 *local_3d0;
  float local_3c4;
  undefined8 *local_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 *local_3a0;
  undefined8 *local_398;
  undefined8 *local_390;
  undefined1 *local_388;
  undefined8 *local_380;
  undefined8 *local_378;
  undefined1 *local_370;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined1 *local_358;
  undefined8 *local_350;
  undefined8 *local_348;
  undefined8 *local_340;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined8 *local_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined1 local_2b8 [16];
  undefined8 *local_2a8;
  undefined8 *local_298;
  undefined1 *local_288;
  undefined8 *local_280;
  undefined1 *local_278;
  undefined8 *local_270;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  undefined8 *local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined1 local_208 [16];
  undefined8 *local_1f8;
  undefined8 *local_1e8;
  undefined1 *local_1d8;
  undefined8 *local_1d0;
  undefined1 *local_1c8;
  undefined8 *local_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined8 *local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined1 local_158 [16];
  undefined8 *local_148;
  undefined8 *local_138;
  undefined1 *local_128;
  undefined8 *local_120;
  undefined1 *local_118;
  undefined8 *local_110;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_a8 [16];
  undefined8 *local_98;
  undefined8 *local_88;
  undefined1 *local_78;
  undefined8 *local_70;
  undefined1 *local_68;
  undefined8 *local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined8 *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_7c8 = (undefined8 *)(in_RSI + 0x10);
  local_7d0 = (undefined8 *)(in_RDX + 0x10);
  local_7c0 = &local_8a8;
  local_794 = 1.0 - in_XMM0_Da;
  local_7a8 = &local_7e8;
  local_288 = local_2b8;
  uVar1 = *local_7d0;
  uVar2 = *(undefined8 *)(in_RDX + 0x18);
  local_248._0_4_ = (float)uVar1;
  local_248._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_240._0_4_ = (float)uVar2;
  uStack_240._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_268 = in_XMM0_Da * (float)local_248;
  fStack_264 = in_XMM0_Da * local_248._4_4_;
  fStack_260 = in_XMM0_Da * (float)uStack_240;
  fStack_25c = in_XMM0_Da * uStack_240._4_4_;
  local_780 = &local_7b8;
  local_6c8 = CONCAT44(local_794,local_794);
  uStack_6c0 = CONCAT44(local_794,local_794);
  local_738 = &local_778;
  uVar3 = *local_7c8;
  uVar4 = *(undefined8 *)(in_RSI + 0x18);
  local_6d8._0_4_ = (float)uVar3;
  local_6d8._4_4_ = (float)((ulong)uVar3 >> 0x20);
  uStack_6d0._0_4_ = (float)uVar4;
  uStack_6d0._4_4_ = (float)((ulong)uVar4 >> 0x20);
  local_6f8 = local_794 * (float)local_6d8;
  fStack_6f4 = local_794 * local_6d8._4_4_;
  fStack_6f0 = local_794 * (float)uStack_6d0;
  fStack_6ec = local_794 * uStack_6d0._4_4_;
  local_688 = CONCAT44(fStack_6f4,local_6f8);
  uStack_680 = CONCAT44(fStack_6ec,fStack_6f0);
  local_698 = (float)local_7e8;
  fStack_694 = (float)((ulong)local_7e8 >> 0x20);
  fStack_690 = (float)uStack_7e0;
  fStack_68c = (float)((ulong)uStack_7e0 >> 0x20);
  local_728 = local_6f8 + local_698;
  fStack_724 = fStack_6f4 + fStack_694;
  fStack_720 = fStack_6f0 + fStack_690;
  fStack_71c = fStack_6ec + fStack_68c;
  local_8a8 = CONCAT44(fStack_724,local_728);
  uStack_8a0 = CONCAT44(fStack_71c,fStack_720);
  local_7f8 = (undefined8 *)(in_RSI + 0x20);
  local_800 = (undefined8 *)(in_RDX + 0x20);
  local_7f0 = &local_8b8;
  local_654 = 1.0 - in_XMM0_Da;
  local_668 = &local_818;
  local_1d8 = local_208;
  uVar5 = *local_800;
  uVar6 = *(undefined8 *)(in_RDX + 0x28);
  local_198._0_4_ = (float)uVar5;
  local_198._4_4_ = (float)((ulong)uVar5 >> 0x20);
  uStack_190._0_4_ = (float)uVar6;
  uStack_190._4_4_ = (float)((ulong)uVar6 >> 0x20);
  local_1b8 = in_XMM0_Da * (float)local_198;
  fStack_1b4 = in_XMM0_Da * local_198._4_4_;
  fStack_1b0 = in_XMM0_Da * (float)uStack_190;
  fStack_1ac = in_XMM0_Da * uStack_190._4_4_;
  local_640 = &local_678;
  local_588 = CONCAT44(local_654,local_654);
  uStack_580 = CONCAT44(local_654,local_654);
  local_5f8 = &local_638;
  uVar7 = *local_7f8;
  uVar8 = *(undefined8 *)(in_RSI + 0x28);
  local_598._0_4_ = (float)uVar7;
  local_598._4_4_ = (float)((ulong)uVar7 >> 0x20);
  uStack_590._0_4_ = (float)uVar8;
  uStack_590._4_4_ = (float)((ulong)uVar8 >> 0x20);
  local_5b8 = local_654 * (float)local_598;
  fStack_5b4 = local_654 * local_598._4_4_;
  fStack_5b0 = local_654 * (float)uStack_590;
  fStack_5ac = local_654 * uStack_590._4_4_;
  local_548 = CONCAT44(fStack_5b4,local_5b8);
  uStack_540 = CONCAT44(fStack_5ac,fStack_5b0);
  local_558 = (float)local_818;
  fStack_554 = (float)((ulong)local_818 >> 0x20);
  fStack_550 = (float)uStack_810;
  fStack_54c = (float)((ulong)uStack_810 >> 0x20);
  local_5e8 = local_5b8 + local_558;
  fStack_5e4 = fStack_5b4 + fStack_554;
  fStack_5e0 = fStack_5b0 + fStack_550;
  fStack_5dc = fStack_5ac + fStack_54c;
  local_8b8 = CONCAT44(fStack_5e4,local_5e8);
  uStack_8b0 = CONCAT44(fStack_5dc,fStack_5e0);
  local_828 = (undefined8 *)(in_RSI + 0x30);
  local_830 = (undefined8 *)(in_RDX + 0x30);
  local_820 = &stack0xfffffffffffff738;
  local_514 = 1.0 - in_XMM0_Da;
  local_528 = &local_848;
  local_128 = local_158;
  uVar9 = *local_830;
  uVar10 = *(undefined8 *)(in_RDX + 0x38);
  local_e8._0_4_ = (float)uVar9;
  local_e8._4_4_ = (float)((ulong)uVar9 >> 0x20);
  uStack_e0._0_4_ = (float)uVar10;
  uStack_e0._4_4_ = (float)((ulong)uVar10 >> 0x20);
  local_108 = in_XMM0_Da * (float)local_e8;
  fStack_104 = in_XMM0_Da * local_e8._4_4_;
  fStack_100 = in_XMM0_Da * (float)uStack_e0;
  fStack_fc = in_XMM0_Da * uStack_e0._4_4_;
  local_500 = &local_538;
  local_448 = CONCAT44(local_514,local_514);
  uStack_440 = CONCAT44(local_514,local_514);
  local_4b8 = &local_4f8;
  uVar11 = *local_828;
  uVar12 = *(undefined8 *)(in_RSI + 0x38);
  local_458._0_4_ = (float)uVar11;
  local_458._4_4_ = (float)((ulong)uVar11 >> 0x20);
  uStack_450._0_4_ = (float)uVar12;
  uStack_450._4_4_ = (float)((ulong)uVar12 >> 0x20);
  local_478 = local_514 * (float)local_458;
  fStack_474 = local_514 * local_458._4_4_;
  fStack_470 = local_514 * (float)uStack_450;
  fStack_46c = local_514 * uStack_450._4_4_;
  local_408 = CONCAT44(fStack_474,local_478);
  uStack_400 = CONCAT44(fStack_46c,fStack_470);
  local_418 = (float)local_848;
  fStack_414 = (float)((ulong)local_848 >> 0x20);
  fStack_410 = (float)uStack_840;
  fStack_40c = (float)((ulong)uStack_840 >> 0x20);
  local_4a8 = local_478 + local_418;
  fStack_4a4 = fStack_474 + fStack_414;
  fStack_4a0 = fStack_470 + fStack_410;
  fStack_49c = fStack_46c + fStack_40c;
  local_858 = (undefined8 *)(in_RSI + 0x40);
  local_860 = (undefined8 *)(in_RDX + 0x40);
  local_850 = &stack0xfffffffffffff728;
  local_3d4 = 1.0 - in_XMM0_Da;
  local_3e8 = &local_878;
  local_78 = local_a8;
  uVar13 = *local_860;
  uVar14 = *(undefined8 *)(in_RDX + 0x48);
  local_38._0_4_ = (float)uVar13;
  local_38._4_4_ = (float)((ulong)uVar13 >> 0x20);
  uStack_30._0_4_ = (float)uVar14;
  uStack_30._4_4_ = (float)((ulong)uVar14 >> 0x20);
  local_58 = in_XMM0_Da * (float)local_38;
  fStack_54 = in_XMM0_Da * local_38._4_4_;
  fStack_50 = in_XMM0_Da * (float)uStack_30;
  fStack_4c = in_XMM0_Da * uStack_30._4_4_;
  local_3c0 = &local_3f8;
  local_308 = CONCAT44(local_3d4,local_3d4);
  uStack_300 = CONCAT44(local_3d4,local_3d4);
  local_388 = &stack0xfffffffffffff728;
  local_390 = &local_3f8;
  local_340 = &local_3b8;
  uVar15 = *local_858;
  uVar16 = *(undefined8 *)(in_RSI + 0x48);
  local_318._0_4_ = (float)uVar15;
  local_318._4_4_ = (float)((ulong)uVar15 >> 0x20);
  uStack_310._0_4_ = (float)uVar16;
  uStack_310._4_4_ = (float)((ulong)uVar16 >> 0x20);
  local_338 = local_3d4 * (float)local_318;
  fStack_334 = local_3d4 * local_318._4_4_;
  fStack_330 = local_3d4 * (float)uStack_310;
  fStack_32c = local_3d4 * uStack_310._4_4_;
  local_320 = &local_3b8;
  local_2c8 = CONCAT44(fStack_334,local_338);
  uStack_2c0 = CONCAT44(fStack_32c,fStack_330);
  local_370 = &stack0xfffffffffffff728;
  local_378 = &local_3b8;
  local_2d8 = (float)local_878;
  fStack_2d4 = (float)((ulong)local_878 >> 0x20);
  fStack_2d0 = (float)uStack_870;
  fStack_2cc = (float)((ulong)uStack_870 >> 0x20);
  local_368 = local_338 + local_2d8;
  fStack_364 = fStack_334 + fStack_2d4;
  fStack_360 = fStack_330 + fStack_2d0;
  fStack_35c = fStack_32c + fStack_2cc;
  local_358 = &stack0xfffffffffffff728;
  local_7a0 = local_7c8;
  local_790 = local_7c0;
  local_784 = local_794;
  local_760 = local_7a8;
  local_758 = local_7c8;
  local_750 = local_780;
  local_748 = local_7c0;
  local_740 = local_7a8;
  local_730 = local_7c0;
  local_718 = local_7c0;
  local_710 = local_7c8;
  local_708 = local_780;
  local_700 = local_738;
  local_6e0 = local_738;
  local_6d8 = uVar3;
  uStack_6d0 = uVar4;
  local_6b8 = local_794;
  fStack_6b4 = local_794;
  fStack_6b0 = local_794;
  fStack_6ac = local_794;
  local_69c = local_794;
  local_660 = local_7f8;
  local_650 = local_7f0;
  local_644 = local_654;
  local_620 = local_668;
  local_618 = local_7f8;
  local_610 = local_640;
  local_608 = local_7f0;
  local_600 = local_668;
  local_5f0 = local_7f0;
  local_5d8 = local_7f0;
  local_5d0 = local_7f8;
  local_5c8 = local_640;
  local_5c0 = local_5f8;
  local_5a0 = local_5f8;
  local_598 = uVar7;
  uStack_590 = uVar8;
  local_578 = local_654;
  fStack_574 = local_654;
  fStack_570 = local_654;
  fStack_56c = local_654;
  local_55c = local_654;
  local_520 = local_828;
  local_510 = local_820;
  local_504 = local_514;
  local_4e0 = local_528;
  local_4d8 = local_828;
  local_4d0 = local_500;
  local_4c8 = local_820;
  local_4c0 = local_528;
  local_4b0 = local_820;
  local_498 = local_820;
  local_490 = local_828;
  local_488 = local_500;
  local_480 = local_4b8;
  local_460 = local_4b8;
  local_458 = uVar11;
  uStack_450 = uVar12;
  local_438 = local_514;
  fStack_434 = local_514;
  fStack_430 = local_514;
  fStack_42c = local_514;
  local_41c = local_514;
  local_3e0 = local_858;
  local_3d0 = local_850;
  local_3c4 = local_3d4;
  local_3a0 = local_3e8;
  local_398 = local_858;
  local_380 = local_3e8;
  local_350 = local_858;
  local_348 = local_390;
  local_318 = uVar15;
  uStack_310 = uVar16;
  local_2f8 = local_3d4;
  fStack_2f4 = local_3d4;
  fStack_2f0 = local_3d4;
  fStack_2ec = local_3d4;
  local_2e8 = local_3d4;
  local_2a8 = local_7d0;
  local_298 = local_7a8;
  local_280 = local_7d0;
  local_278 = local_288;
  local_270 = local_7a8;
  local_250 = local_7a8;
  local_248 = uVar1;
  uStack_240 = uVar2;
  local_1f8 = local_800;
  local_1e8 = local_668;
  local_1d0 = local_800;
  local_1c8 = local_1d8;
  local_1c0 = local_668;
  local_1a0 = local_668;
  local_198 = uVar5;
  uStack_190 = uVar6;
  local_148 = local_830;
  local_138 = local_528;
  local_120 = local_830;
  local_118 = local_128;
  local_110 = local_528;
  local_f0 = local_528;
  local_e8 = uVar9;
  uStack_e0 = uVar10;
  local_98 = local_860;
  local_88 = local_3e8;
  local_70 = local_860;
  local_68 = local_78;
  local_60 = local_3e8;
  local_40 = local_3e8;
  local_38 = uVar13;
  uStack_30 = uVar14;
  local_878 = CONCAT44(fStack_54,local_58);
  uStack_870 = CONCAT44(fStack_4c,fStack_50);
  local_848 = CONCAT44(fStack_104,local_108);
  uStack_840 = CONCAT44(fStack_fc,fStack_100);
  local_818 = CONCAT44(fStack_1b4,local_1b8);
  uStack_810 = CONCAT44(fStack_1ac,fStack_1b0);
  local_7e8 = CONCAT44(fStack_264,local_268);
  uStack_7e0 = CONCAT44(fStack_25c,fStack_260);
  local_7b8 = local_6c8;
  uStack_7b0 = uStack_6c0;
  local_778 = local_688;
  uStack_770 = uStack_680;
  local_678 = local_588;
  uStack_670 = uStack_580;
  local_638 = local_548;
  uStack_630 = uStack_540;
  local_538 = local_448;
  uStack_530 = uStack_440;
  local_4f8 = local_408;
  uStack_4f0 = uStack_400;
  local_3f8 = local_308;
  uStack_3f0 = uStack_300;
  local_3b8 = local_2c8;
  uStack_3b0 = uStack_2c0;
  TriangleLight((TriangleLight *)CONCAT44(fStack_49c,fStack_4a0),
                (Vec3fa *)CONCAT44(fStack_4a4,local_4a8),(Vec3fa *)CONCAT44(fStack_35c,fStack_360),
                (Vec3fa *)CONCAT44(fStack_364,local_368),(Vec3fa *)in_RDI);
  return in_RDI;
}

Assistant:

static TriangleLight lerp(const TriangleLight& light0, const TriangleLight& light1, const float f)
      {
        return TriangleLight(embree::lerp(light0.v0,light1.v0,f),
                             embree::lerp(light0.v1,light1.v1,f),
                             embree::lerp(light0.v2,light1.v2,f),
                             embree::lerp(light0.L,light1.L,f));
      }